

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O1

void DrawOneWeapon(player_t *CPlayer,int x,int *y,AWeapon *weapon)

{
  PClass *pPVar1;
  FTexture *tex;
  int iVar2;
  FTextureID FVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar4;
  AWeapon *pAVar5;
  int h;
  AWeapon *pAVar6;
  bool bVar7;
  
  if (((weapon->super_AInventory).field_0x4dd & 4) != 0) {
    return;
  }
  pAVar6 = (weapon->SisterWeapon).field_0.p;
  if (pAVar6 != (AWeapon *)0x0) {
    if (((pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20) ==
        0) {
      pAVar6 = (weapon->SisterWeapon).field_0.p;
      if ((pAVar6 != (AWeapon *)0x0) &&
         (((pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20)
          != 0)) {
        (weapon->SisterWeapon).field_0.p = (AWeapon *)0x0;
        pAVar6 = (AWeapon *)0x0;
      }
      if ((pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.Class ==
          (PClass *)0x0) {
        iVar2 = (**(pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.
                   _vptr_DObject)(pAVar6);
        (pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar2);
      }
      pPVar1 = (pAVar6->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
      if ((weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.Class ==
          (PClass *)0x0) {
        iVar2 = (**(weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.
                   _vptr_DObject)(weapon);
        (weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_00,iVar2);
      }
      pPVar4 = (weapon->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
      bVar7 = pPVar4 != (PClass *)0x0;
      if (pPVar4 != pPVar1 && bVar7) {
        do {
          pPVar4 = pPVar4->ParentClass;
          bVar7 = pPVar4 != (PClass *)0x0;
          if (pPVar4 == pPVar1) break;
        } while (pPVar4 != (PClass *)0x0);
      }
      if (bVar7) {
        return;
      }
    }
    else {
      (weapon->SisterWeapon).field_0.p = (AWeapon *)0x0;
    }
  }
  pAVar6 = CPlayer->ReadyWeapon;
  iVar2 = 0x6666;
  if (pAVar6 != (AWeapon *)0x0) {
    if (pAVar6 != weapon) {
      pAVar5 = (pAVar6->SisterWeapon).field_0.p;
      if ((pAVar5 != (AWeapon *)0x0) &&
         (((pAVar5->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20)
          != 0)) {
        (pAVar6->SisterWeapon).field_0.p = (AWeapon *)0x0;
        pAVar5 = (AWeapon *)0x0;
      }
      if (pAVar5 != weapon) goto LAB_00604cb3;
    }
    iVar2 = 0xd999;
  }
LAB_00604cb3:
  FVar3 = GetInventoryIcon(&weapon->super_AInventory,0x10,(bool *)0x0);
  if (0 < FVar3.texnum) {
    tex = TexMan.Textures.Array[(uint)FVar3.texnum].Texture;
    h = 8;
    if (tex->Width <= tex->Height) {
      *y = *y + -8;
      h = 0x10;
    }
    DrawImageToBox(tex,x + -0x18,*y,0x14,h,iVar2);
    *y = *y + -10;
  }
  return;
}

Assistant:

static void DrawOneWeapon(player_t * CPlayer, int x, int & y, AWeapon * weapon)
{
	int trans;

	// Powered up weapons and inherited sister weapons are not displayed.
	if (weapon->WeaponFlags & WIF_POWERED_UP) return;
	if (weapon->SisterWeapon && weapon->IsKindOf(weapon->SisterWeapon->GetClass())) return;

	trans=0x6666;
	if (CPlayer->ReadyWeapon)
	{
		if (weapon==CPlayer->ReadyWeapon || weapon==CPlayer->ReadyWeapon->SisterWeapon) trans=0xd999;
	}

	FTextureID picnum = GetInventoryIcon(weapon, DI_ALTICONFIRST);

	if (picnum.isValid())
	{
		FTexture * tex = TexMan[picnum];
		int w = tex->GetWidth();
		int h = tex->GetHeight();
		int rh;
		if (w>h) rh=8;
		else rh=16,y-=8;		// don't draw tall sprites too small!
		DrawImageToBox(tex, x-24, y, 20, rh, trans);
		y-=10;
	}
}